

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O2

void __thiscall
S2MinDistanceCellUnionTarget::~S2MinDistanceCellUnionTarget(S2MinDistanceCellUnionTarget *this)

{
  (this->super_S2MinDistanceTarget)._vptr_S2DistanceTarget =
       (_func_int **)&PTR__S2MinDistanceCellUnionTarget_003058f8;
  std::unique_ptr<S2ClosestCellQuery,_std::default_delete<S2ClosestCellQuery>_>::~unique_ptr
            (&this->query_);
  S2CellIndex::~S2CellIndex(&this->index_);
  std::_Vector_base<S2CellId,_std::allocator<S2CellId>_>::~_Vector_base
            (&(this->cell_union_).cell_ids_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)
  ;
  return;
}

Assistant:

S2MinDistanceCellUnionTarget::~S2MinDistanceCellUnionTarget() {
}